

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

UINT32 FillBuffer(void *drvStruct,void *userParam,UINT32 bufSize,void *data)

{
  FILE *__stream;
  byte bVar1;
  UINT32 renderedBytes;
  PlayerA *myPlr;
  void *data_local;
  UINT32 bufSize_local;
  void *userParam_local;
  void *drvStruct_local;
  
  bVar1 = PlayerA::GetState((PlayerA *)userParam);
  __stream = _stderr;
  if ((bVar1 & 1) == 0) {
    bVar1 = PlayerA::GetState((PlayerA *)userParam);
    fprintf(__stream,"Player Warning: calling Render while not playing! playState = 0x%02X\n",
            (ulong)bVar1);
    memset(data,0,(ulong)bufSize);
    drvStruct_local._4_4_ = bufSize;
  }
  else {
    OSMutex_Lock(renderMtx);
    drvStruct_local._4_4_ = PlayerA::Render((PlayerA *)userParam,bufSize,data);
    OSMutex_Unlock(renderMtx);
  }
  return drvStruct_local._4_4_;
}

Assistant:

static UINT32 FillBuffer(void* drvStruct, void* userParam, UINT32 bufSize, void* data)
{
	PlayerA& myPlr = *(PlayerA*)userParam;
	if (! (myPlr.GetState() & PLAYSTATE_PLAY))
	{
		fprintf(stderr, "Player Warning: calling Render while not playing! playState = 0x%02X\n", myPlr.GetState());
		memset(data, 0x00, bufSize);
		return bufSize;
	}
	
	UINT32 renderedBytes;
	OSMutex_Lock(renderMtx);
	renderedBytes = myPlr.Render(bufSize, data);
	OSMutex_Unlock(renderMtx);
	
	return renderedBytes;
}